

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * operator+=(QString *a,
                    QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_char16_t>,_QStringBuilder<QStringBuilder<char16_t,_QString_&>,_char16_t>_>,_char16_t>
                    *b)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  QString *pQVar4;
  long lVar5;
  long lVar6;
  char16_t *__src;
  QChar *pQVar7;
  QChar *__dest;
  
  pDVar2 = (a->d).d;
  lVar5 = (a->d).size;
  lVar6 = (((b->a).b.a.b)->d).size;
  lVar3 = (b->a).a.a.m_size;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)lVar5);
  }
  lVar5 = lVar6 + lVar3 + lVar5 + 4;
  pDVar2 = (a->d).d;
  if (pDVar2 == (Data *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = (pDVar2->super_QArrayData).alloc -
            (((long)((long)(a->d).ptr -
                    ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >>
             1) + (a->d).size);
  }
  if (lVar6 < lVar5) {
    if (pDVar2 == (Data *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (pDVar2->super_QArrayData).alloc * 2;
    }
    if (lVar6 < lVar5) {
      lVar6 = lVar5;
    }
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar2->super_QArrayData).alloc -
        ((long)((long)(a->d).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1)
        <= lVar6)) {
      lVar5 = (a->d).size;
      if (lVar6 < lVar5) {
        lVar6 = lVar5;
      }
      QString::reallocData((longlong)a,(AllocationOption)lVar6);
    }
    pDVar2 = (a->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar2 = (a->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  pQVar7 = (QChar *)((a->d).ptr + (a->d).size);
  lVar5 = (b->a).a.a.m_size;
  QAbstractConcatenable::appendLatin1To((b->a).a.a,pQVar7);
  pQVar7 = pQVar7 + lVar5;
  __dest = pQVar7 + 2;
  pQVar7->ucs = (b->a).a.b;
  pQVar7[1].ucs = (b->a).b.a.a;
  pQVar4 = (b->a).b.a.b;
  lVar5 = (pQVar4->d).size;
  if (lVar5 != 0) {
    __src = (pQVar4->d).ptr;
    if (__src == (char16_t *)0x0) {
      __src = (char16_t *)&QString::_empty;
    }
    memcpy(__dest,__src,lVar5 * 2);
  }
  __dest[lVar5].ucs = (b->a).b.b;
  (__dest + lVar5)[1].ucs = b->b;
  QString::resize((longlong)a);
  return a;
}

Assistant:

QString &operator+=(QString &a, const QStringBuilder<A, B> &b)
{
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    QChar *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    // we need to resize after the appendTo for the case str+=foo+str
    a.resize(it - a.constData()); //may be smaller than len if there was conversion from utf8
    return a;
}